

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void deserialize_node<char_const*,int,unsigned_int>
               (IsoHPlane *node,char **in,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
               vector<char,_std::allocator<char>_> *buffer2,bool diff_endian)

{
  pointer pCVar1;
  pointer pvVar2;
  size_t sVar3;
  pointer __dest;
  vector<double,_std::allocator<double>_> *vec;
  pointer vec_00;
  vector<ColType,_std::allocator<ColType>_> *this;
  size_t veclen;
  size_t data_sizets [10];
  double data_doubles [5];
  
  if (!interrupt_switch) {
    read_bytes<double,double>(data_doubles,5,in,buffer2,diff_endian);
    node->split_point = data_doubles[0];
    node->score = data_doubles[1];
    node->range_low = data_doubles[2];
    node->range_high = data_doubles[3];
    node->remainder = data_doubles[4];
    read_bytes<unsigned_long,unsigned_int>(data_sizets,10,in,buffer2,diff_endian);
    node->hplane_left = data_sizets[0];
    node->hplane_right = data_sizets[1];
    read_bytes<unsigned_long,unsigned_int>(&node->col_num,data_sizets[2],in,buffer2,diff_endian);
    if (data_sizets[3] != 0) {
      this = &node->col_type;
      std::vector<ColType,_std::allocator<ColType>_>::resize(this,data_sizets[3]);
      std::vector<ColType,_std::allocator<ColType>_>::_M_shrink_to_fit(this);
      __dest = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)__dest) < data_sizets[3])
      {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (buffer,data_sizets[3] * 2);
        __dest = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
      }
      sVar3 = data_sizets[3];
      if (data_sizets[3] == 0) {
        data_sizets[3] = 0;
      }
      else {
        memcpy(__dest,*in,data_sizets[3]);
        *in = *in + sVar3;
        __dest = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
      }
      pCVar1 = (this->super__Vector_base<ColType,_std::allocator<ColType>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar3 = 0; data_sizets[3] != sVar3; sVar3 = sVar3 + 1) {
        pCVar1[sVar3] = (uint)__dest[sVar3];
      }
    }
    read_bytes<double,double>(&node->coef,data_sizets[4],in,buffer2,diff_endian);
    read_bytes<double,double>(&node->mean,data_sizets[5],in,buffer2,diff_endian);
    if (data_sizets[6] != 0) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(&node->cat_coef,data_sizets[6]);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::_M_shrink_to_fit(&node->cat_coef);
      pvVar2 = (node->cat_coef).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (vec_00 = (node->cat_coef).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; vec_00 != pvVar2; vec_00 = vec_00 + 1
          ) {
        read_bytes<unsigned_long,unsigned_int>(&veclen,1,in,buffer2,diff_endian);
        read_bytes<double,double>(vec_00,veclen,in,buffer2,diff_endian);
      }
    }
    read_bytes<int,int>(&node->chosen_cat,data_sizets[7],in,buffer2,diff_endian);
    read_bytes<double,double>(&node->fill_val,data_sizets[8],in,buffer2,diff_endian);
    read_bytes<double,double>(&node->fill_new,data_sizets[9],in,buffer2,diff_endian);
  }
  return;
}

Assistant:

void deserialize_node(IsoHPlane &node, itype &in, std::vector<uint8_t> &buffer, std::vector<char> &buffer2, const bool diff_endian)
{
    if (interrupt_switch) return;

    double data_doubles[5];
    read_bytes<double, double>((void*)data_doubles, (size_t)5, in, buffer2, diff_endian);
    node.split_point = data_doubles[0];
    node.score = data_doubles[1];
    node.range_low = data_doubles[2];
    node.range_high = data_doubles[3];
    node.remainder = data_doubles[4];

    size_t data_sizets[10];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)10, in, buffer2, diff_endian);

    node.hplane_left = data_sizets[0];
    node.hplane_right = data_sizets[1];

    read_bytes<size_t, saved_size_t>(node.col_num, data_sizets[2], in, buffer2, diff_endian);

    if (data_sizets[3]) {
        node.col_type.resize(data_sizets[3]);
        node.col_type.shrink_to_fit();
        if (buffer.size() < data_sizets[3])
            buffer.resize((size_t)2 * data_sizets[3]);
        read_bytes<uint8_t>((void*)buffer.data(), data_sizets[3], in);
        for (size_t ix = 0; ix < data_sizets[3]; ix++)
            node.col_type[ix] = (ColType)buffer[ix];
    }

    read_bytes<double, double>(node.coef, data_sizets[4], in, buffer2, diff_endian);

    read_bytes<double, double>(node.mean, data_sizets[5], in, buffer2, diff_endian);

    if (data_sizets[6]) {
        node.cat_coef.resize(data_sizets[6]);
        node.cat_coef.shrink_to_fit();
        size_t veclen;
        for (auto &vec : node.cat_coef) {
            read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer2, diff_endian);
            read_bytes<double, double>(vec, veclen, in, buffer2, diff_endian);
        }
    }

    read_bytes<int, saved_int_t>(node.chosen_cat, data_sizets[7], in, buffer2, diff_endian);

    read_bytes<double, double>(node.fill_val, data_sizets[8], in, buffer2, diff_endian);

    read_bytes<double, double>(node.fill_new, data_sizets[9], in, buffer2, diff_endian);
}